

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

int soplex::
    SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (IdxElement *keys,IdxCompare *compare,int start,int end,int size,int start2,int end2,
              bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  fpclass_type fVar8;
  int32_t iVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int32_t iVar24;
  fpclass_type fVar25;
  int32_t iVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar30;
  uint uVar31;
  long lVar32;
  fpclass_type *pfVar33;
  uint uVar34;
  uint uVar35;
  undefined4 in_register_00000084;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  cpp_dec_float<50U,_int,_void> local_388;
  long local_350;
  undefined8 local_348;
  long local_340;
  type t;
  IdxElement local_300;
  IdxElement local_2c4;
  IdxElement local_288;
  IdxElement local_24c;
  IdxElement local_210;
  IdxElement local_1d4;
  IdxElement local_198;
  IdxElement local_15c;
  IdxElement local_120;
  IdxElement local_e4;
  IdxElement local_a8;
  IdxElement local_6c;
  
  local_348 = CONCAT44(in_register_00000084,size);
  if (end <= start) {
    return 0;
  }
  if (start + 1 == end) {
    return 1;
  }
  if (start2 <= start) {
    start2 = start;
  }
  uVar31 = end - 1;
  if ((int)uVar31 <= start2 + size) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,end,compare,start2,type);
    return uVar31;
  }
  iVar29 = (int)(start2 + uVar31) / 2;
  pIVar1 = keys + iVar29;
  pIVar2 = keys + iVar29;
  pnVar30 = &pIVar2->val;
  iVar29 = pIVar2->idx;
  uVar11 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
  uVar13 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
  uVar14 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
  uVar15 = *(undefined8 *)(pnVar30->m_backend).data._M_elems;
  uVar16 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
  iVar7 = (pIVar2->val).m_backend.exp;
  bVar5 = (pIVar2->val).m_backend.neg;
  fVar8 = (pIVar2->val).m_backend.fpclass;
  iVar9 = (pIVar2->val).m_backend.prec_elem;
  local_350 = (long)(int)uVar31;
  local_340 = -local_350;
  lVar28 = (long)start2;
  uVar36 = uVar31;
  uVar34 = start2;
  do {
    uVar37 = (ulong)uVar36;
    uVar35 = uVar34;
    if (type) {
      if ((int)uVar34 < (int)uVar31) {
        pfVar33 = &keys[(int)uVar34].val.m_backend.fpclass;
        lVar32 = (int)uVar34 + local_340;
        lVar38 = 0;
        do {
          local_6c.idx = pfVar33[-0xd];
          local_6c.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
          local_6c.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
          local_6c.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
          local_6c.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
          local_6c.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
          local_6c.val.m_backend.exp = pfVar33[-2];
          local_6c.val.m_backend.neg = *(bool *)(pfVar33 + -1);
          local_6c.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
          local_1d4.idx = iVar29;
          local_1d4.val.m_backend.data._M_elems._0_8_ = uVar15;
          local_1d4.val.m_backend.data._M_elems._8_8_ = uVar16;
          local_1d4.val.m_backend.data._M_elems._16_8_ = uVar13;
          local_1d4.val.m_backend.data._M_elems._24_8_ = uVar14;
          local_1d4.val.m_backend.data._M_elems._32_8_ = uVar11;
          local_1d4.val.m_backend.exp = iVar7;
          local_1d4.val.m_backend.neg = bVar5;
          local_1d4.val.m_backend.fpclass = fVar8;
          local_1d4.val.m_backend.prec_elem = iVar9;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_388,compare,&local_6c,&local_1d4);
          if (local_388.fpclass == cpp_dec_float_NaN) {
            uVar35 = uVar34 - (int)lVar38;
            break;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_388,&t.m_backend);
          if (-1 < iVar27) {
            uVar35 = uVar34 - (int)lVar38;
            break;
          }
          lVar38 = lVar38 + -1;
          pfVar33 = pfVar33 + 0xf;
          uVar35 = uVar31;
        } while (lVar32 != lVar38);
      }
      if (start2 < (int)uVar36) {
        uVar37 = (ulong)(int)uVar36;
        pfVar33 = &keys[uVar37].val.m_backend.fpclass;
        do {
          local_a8.idx = pfVar33[-0xd];
          local_a8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
          local_a8.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
          local_a8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
          local_a8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
          local_a8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
          local_a8.val.m_backend.exp = pfVar33[-2];
          local_a8.val.m_backend.neg = *(bool *)(pfVar33 + -1);
          local_a8.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
          local_210.idx = iVar29;
          local_210.val.m_backend.data._M_elems._0_8_ = uVar15;
          local_210.val.m_backend.data._M_elems._8_8_ = uVar16;
          local_210.val.m_backend.data._M_elems._16_8_ = uVar13;
          local_210.val.m_backend.data._M_elems._24_8_ = uVar14;
          local_210.val.m_backend.data._M_elems._32_8_ = uVar11;
          local_210.val.m_backend.exp = iVar7;
          local_210.val.m_backend.neg = bVar5;
          local_210.val.m_backend.fpclass = fVar8;
          local_210.val.m_backend.prec_elem = iVar9;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_388,compare,&local_a8,&local_210);
          if (local_388.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_388,&t.m_backend);
          if (iVar27 < 0) break;
          uVar37 = uVar37 - 1;
          pfVar33 = pfVar33 + -0xf;
        } while (lVar28 < (long)uVar37);
      }
    }
    else {
      if ((int)uVar34 < (int)uVar31) {
        pfVar33 = &keys[(int)uVar34].val.m_backend.fpclass;
        do {
          local_e4.idx = pfVar33[-0xd];
          local_e4.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
          local_e4.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
          local_e4.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
          local_e4.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
          local_e4.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
          local_e4.val.m_backend.exp = pfVar33[-2];
          local_e4.val.m_backend.neg = *(bool *)(pfVar33 + -1);
          local_e4.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
          local_24c.idx = iVar29;
          local_24c.val.m_backend.data._M_elems._0_8_ = uVar15;
          local_24c.val.m_backend.data._M_elems._8_8_ = uVar16;
          local_24c.val.m_backend.data._M_elems._16_8_ = uVar13;
          local_24c.val.m_backend.data._M_elems._24_8_ = uVar14;
          local_24c.val.m_backend.data._M_elems._32_8_ = uVar11;
          local_24c.val.m_backend.exp = iVar7;
          local_24c.val.m_backend.neg = bVar5;
          local_24c.val.m_backend.fpclass = fVar8;
          local_24c.val.m_backend.prec_elem = iVar9;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_388,compare,&local_e4,&local_24c);
          uVar35 = uVar34;
          if (local_388.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_388,&t.m_backend);
          if (0 < iVar27) break;
          uVar34 = uVar34 + 1;
          pfVar33 = pfVar33 + 0xf;
          uVar35 = uVar31;
        } while (uVar31 != uVar34);
      }
      if (start2 < (int)uVar36) {
        uVar37 = (ulong)(int)uVar36;
        pfVar33 = &keys[uVar37].val.m_backend.fpclass;
        do {
          local_120.idx = pfVar33[-0xd];
          local_120.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
          local_120.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
          local_120.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
          local_120.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
          local_120.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
          local_120.val.m_backend.exp = pfVar33[-2];
          local_120.val.m_backend.neg = *(bool *)(pfVar33 + -1);
          local_120.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
          local_288.idx = iVar29;
          local_288.val.m_backend.data._M_elems._0_8_ = uVar15;
          local_288.val.m_backend.data._M_elems._8_8_ = uVar16;
          local_288.val.m_backend.data._M_elems._16_8_ = uVar13;
          local_288.val.m_backend.data._M_elems._24_8_ = uVar14;
          local_288.val.m_backend.data._M_elems._32_8_ = uVar11;
          local_288.val.m_backend.exp = iVar7;
          local_288.val.m_backend.neg = bVar5;
          local_288.val.m_backend.fpclass = fVar8;
          local_288.val.m_backend.prec_elem = iVar9;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_388,compare,&local_120,&local_288);
          if (local_388.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_388,&t.m_backend);
          if (iVar27 < 1) break;
          uVar37 = uVar37 - 1;
          pfVar33 = pfVar33 + -0xf;
        } while (lVar28 < (long)uVar37);
      }
    }
    uVar36 = (uint)uVar37;
    if ((int)uVar36 <= (int)uVar35) break;
    iVar27 = keys[(int)uVar35].idx;
    uVar12 = *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 8);
    puVar3 = keys[(int)uVar35].val.m_backend.data._M_elems + 4;
    uVar17 = *(undefined8 *)puVar3;
    uVar18 = *(undefined8 *)(puVar3 + 2);
    uVar19 = *(undefined8 *)keys[(int)uVar35].val.m_backend.data._M_elems;
    uVar20 = *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 2);
    iVar10 = keys[(int)uVar35].val.m_backend.exp;
    bVar6 = keys[(int)uVar35].val.m_backend.neg;
    keys[(int)uVar35].idx = keys[(int)uVar36].idx;
    *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 8) =
         *(undefined8 *)(keys[(int)uVar36].val.m_backend.data._M_elems + 8);
    uVar21 = *(undefined8 *)keys[(int)uVar36].val.m_backend.data._M_elems;
    uVar22 = *(undefined8 *)(keys[(int)uVar36].val.m_backend.data._M_elems + 2);
    puVar3 = keys[(int)uVar36].val.m_backend.data._M_elems + 4;
    uVar23 = *(undefined8 *)(puVar3 + 2);
    puVar4 = keys[(int)uVar35].val.m_backend.data._M_elems + 4;
    *(undefined8 *)puVar4 = *(undefined8 *)puVar3;
    *(undefined8 *)(puVar4 + 2) = uVar23;
    *(undefined8 *)keys[(int)uVar35].val.m_backend.data._M_elems = uVar21;
    *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 2) = uVar22;
    keys[(int)uVar35].val.m_backend.exp = keys[(int)uVar36].val.m_backend.exp;
    keys[(int)uVar35].val.m_backend.neg = keys[(int)uVar36].val.m_backend.neg;
    keys[(int)uVar36].idx = iVar27;
    *(undefined8 *)keys[(int)uVar36].val.m_backend.data._M_elems = uVar19;
    *(undefined8 *)(keys[(int)uVar36].val.m_backend.data._M_elems + 2) = uVar20;
    puVar3 = keys[(int)uVar36].val.m_backend.data._M_elems + 4;
    *(undefined8 *)puVar3 = uVar17;
    *(undefined8 *)(puVar3 + 2) = uVar18;
    *(undefined8 *)(keys[(int)uVar36].val.m_backend.data._M_elems + 8) = uVar12;
    keys[(int)uVar36].val.m_backend.exp = iVar10;
    keys[(int)uVar36].val.m_backend.neg = bVar6;
    fVar25 = keys[(int)uVar35].val.m_backend.fpclass;
    iVar26 = keys[(int)uVar35].val.m_backend.prec_elem;
    iVar24 = keys[(int)uVar36].val.m_backend.prec_elem;
    keys[(int)uVar35].val.m_backend.fpclass = keys[(int)uVar36].val.m_backend.fpclass;
    keys[(int)uVar35].val.m_backend.prec_elem = iVar24;
    keys[(int)uVar36].val.m_backend.fpclass = fVar25;
    keys[(int)uVar36].val.m_backend.prec_elem = iVar26;
    uVar34 = uVar35 + 1;
    uVar36 = uVar36 - 1;
  } while( true );
  if (type) {
    if ((int)uVar35 < (int)uVar31) {
      pfVar33 = &keys[(int)uVar35].val.m_backend.fpclass;
      uVar34 = uVar35;
      do {
        local_15c.idx = pfVar33[-0xd];
        local_15c.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
        local_15c.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
        local_15c.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
        local_15c.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
        local_15c.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
        local_15c.val.m_backend.exp = pfVar33[-2];
        local_15c.val.m_backend.neg = *(bool *)(pfVar33 + -1);
        local_15c.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
        local_2c4.idx = iVar29;
        local_2c4.val.m_backend.data._M_elems._0_8_ = uVar15;
        local_2c4.val.m_backend.data._M_elems._8_8_ = uVar16;
        local_2c4.val.m_backend.data._M_elems._16_8_ = uVar13;
        local_2c4.val.m_backend.data._M_elems._24_8_ = uVar14;
        local_2c4.val.m_backend.data._M_elems._32_8_ = uVar11;
        local_2c4.val.m_backend.exp = iVar7;
        local_2c4.val.m_backend.neg = bVar5;
        local_2c4.val.m_backend.fpclass = fVar8;
        local_2c4.val.m_backend.prec_elem = iVar9;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_388,compare,&local_2c4,&local_15c);
        uVar35 = uVar34;
        if (local_388.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&t.m_backend,0,(type *)0x0);
        iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_388,&t.m_backend);
        if (iVar27 < 0) break;
        uVar34 = uVar34 + 1;
        pfVar33 = pfVar33 + 0xf;
        uVar35 = uVar31;
      } while (uVar31 != uVar34);
    }
    if (uVar35 == start2) {
      iVar29 = keys[lVar28].idx;
      uVar11 = *(undefined8 *)(keys[lVar28].val.m_backend.data._M_elems + 8);
      puVar3 = keys[lVar28].val.m_backend.data._M_elems + 4;
      uVar13 = *(undefined8 *)puVar3;
      uVar14 = *(undefined8 *)(puVar3 + 2);
      uVar15 = *(undefined8 *)keys[lVar28].val.m_backend.data._M_elems;
      uVar16 = *(undefined8 *)(keys[lVar28].val.m_backend.data._M_elems + 2);
      iVar7 = keys[lVar28].val.m_backend.exp;
      bVar5 = keys[lVar28].val.m_backend.neg;
      keys[lVar28].idx = pIVar1->idx;
      *(undefined8 *)(keys[lVar28].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
      uVar12 = *(undefined8 *)(pnVar30->m_backend).data._M_elems;
      uVar17 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
      uVar18 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
      puVar3 = keys[lVar28].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar3 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar3 + 2) = uVar18;
      *(undefined8 *)keys[lVar28].val.m_backend.data._M_elems = uVar12;
      *(undefined8 *)(keys[lVar28].val.m_backend.data._M_elems + 2) = uVar17;
      keys[lVar28].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[lVar28].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar29;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8) = uVar11;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4) = uVar13;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6) = uVar14;
      *(undefined8 *)(pnVar30->m_backend).data._M_elems = uVar15;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2) = uVar16;
      (pIVar1->val).m_backend.exp = iVar7;
      (pIVar1->val).m_backend.neg = bVar5;
      fVar8 = keys[lVar28].val.m_backend.fpclass;
      iVar24 = keys[lVar28].val.m_backend.prec_elem;
      iVar9 = (pIVar1->val).m_backend.prec_elem;
      keys[lVar28].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[lVar28].val.m_backend.prec_elem = iVar9;
      (pIVar1->val).m_backend.fpclass = fVar8;
      (pIVar1->val).m_backend.prec_elem = iVar24;
      uVar35 = start2 + 1;
    }
  }
  else {
    if (start2 < (int)uVar36) {
      uVar37 = (ulong)(int)uVar36;
      pfVar33 = &keys[uVar37].val.m_backend.fpclass;
      do {
        local_198.idx = pfVar33[-0xd];
        local_198.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
        local_198.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
        local_198.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
        local_198.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
        local_198.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
        local_198.val.m_backend.exp = pfVar33[-2];
        local_198.val.m_backend.neg = *(bool *)(pfVar33 + -1);
        local_198.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
        local_300.idx = iVar29;
        local_300.val.m_backend.data._M_elems._0_8_ = uVar15;
        local_300.val.m_backend.data._M_elems._8_8_ = uVar16;
        local_300.val.m_backend.data._M_elems._16_8_ = uVar13;
        local_300.val.m_backend.data._M_elems._24_8_ = uVar14;
        local_300.val.m_backend.data._M_elems._32_8_ = uVar11;
        local_300.val.m_backend.exp = iVar7;
        local_300.val.m_backend.neg = bVar5;
        local_300.val.m_backend.fpclass = fVar8;
        local_300.val.m_backend.prec_elem = iVar9;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_388,compare,&local_300,&local_198);
        if (local_388.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&t.m_backend,0,(type *)0x0);
        iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_388,&t.m_backend);
        if (0 < iVar27) break;
        uVar37 = uVar37 - 1;
        pfVar33 = pfVar33 + -0xf;
      } while (lVar28 < (long)uVar37);
    }
    uVar36 = (uint)uVar37;
    if (uVar36 == uVar31) {
      iVar29 = keys[local_350].idx;
      uVar11 = *(undefined8 *)(keys[local_350].val.m_backend.data._M_elems + 8);
      puVar3 = keys[local_350].val.m_backend.data._M_elems + 4;
      uVar13 = *(undefined8 *)puVar3;
      uVar14 = *(undefined8 *)(puVar3 + 2);
      uVar15 = *(undefined8 *)keys[local_350].val.m_backend.data._M_elems;
      uVar16 = *(undefined8 *)(keys[local_350].val.m_backend.data._M_elems + 2);
      iVar7 = keys[local_350].val.m_backend.exp;
      bVar5 = keys[local_350].val.m_backend.neg;
      keys[local_350].idx = pIVar1->idx;
      fVar8 = keys[local_350].val.m_backend.fpclass;
      iVar24 = keys[local_350].val.m_backend.prec_elem;
      *(undefined8 *)(keys[local_350].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
      uVar12 = *(undefined8 *)(pnVar30->m_backend).data._M_elems;
      uVar17 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
      uVar18 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
      puVar3 = keys[local_350].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar3 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar3 + 2) = uVar18;
      *(undefined8 *)keys[local_350].val.m_backend.data._M_elems = uVar12;
      *(undefined8 *)(keys[local_350].val.m_backend.data._M_elems + 2) = uVar17;
      keys[local_350].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[local_350].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      iVar9 = (pIVar1->val).m_backend.prec_elem;
      keys[local_350].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[local_350].val.m_backend.prec_elem = iVar9;
      pIVar1->idx = iVar29;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8) = uVar11;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4) = uVar13;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6) = uVar14;
      *(undefined8 *)(pnVar30->m_backend).data._M_elems = uVar15;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2) = uVar16;
      (pIVar1->val).m_backend.exp = iVar7;
      (pIVar1->val).m_backend.neg = bVar5;
      (pIVar1->val).m_backend.fpclass = fVar8;
      (pIVar1->val).m_backend.prec_elem = iVar24;
      uVar36 = end - 2;
    }
  }
  iVar29 = (int)local_348;
  if ((int)(uVar36 - start2) < iVar29 * 2) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,uVar36 + 1,compare,start2,!type);
    if (iVar29 <= (int)(uVar35 - start2)) {
      return uVar35 - 1;
    }
    iVar29 = (start2 + size) - uVar35;
    start2 = uVar35;
  }
  else {
    end = uVar36 + 1;
  }
  iVar29 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                     (keys,compare,start,end,iVar29,start2,end2,!type);
  return iVar29;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}